

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex::Vertex
          (Vertex *this,SimpleState *s,int64_t id)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  double dVar1;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::__cxx11::
  list<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>
  ::list((list<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>
          *)0x104a1c);
  std::__cxx11::
  list<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ::list((list<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
          *)0x104a2f);
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[10] = dVar1;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[0xb] = dVar1;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[0xc] = dVar1;
  vertex_iterator::vertex_iterator((vertex_iterator *)0x104a72);
  return;
}

Assistant:

Vertex(State s, int64_t id) : state(s), vertex_id(id) {}